

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_mem.cpp
# Opt level: O1

RK_U32 mpp_mem_total_now(void)

{
  RK_U32 RVar1;
  pthread_mutex_t *__mutex;
  MppMemService *pMVar2;
  
  pMVar2 = MppMemService::get_inst();
  __mutex = (pthread_mutex_t *)pMVar2->m_lock;
  if (__mutex != (pthread_mutex_t *)0x0) {
    pthread_mutex_lock(__mutex);
  }
  RVar1 = pMVar2->m_total_size;
  if (__mutex != (pthread_mutex_t *)0x0) {
    pthread_mutex_unlock(__mutex);
  }
  return RVar1;
}

Assistant:

RK_U32 mpp_mem_total_now()
{
    MppMemService *srv = MppMemService::get_inst();
    AutoMutex auto_lock(srv->m_lock);

    return srv->total_now();
}